

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

uint32 google::protobuf::strtou32_adaptor(char *nptr,char **endptr,int base)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  unsigned_long result;
  int saved_errno;
  int base_local;
  char **endptr_local;
  char *nptr_local;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  piVar2 = __errno_location();
  *piVar2 = 0;
  uVar3 = strtoul(nptr,endptr,base);
  piVar2 = __errno_location();
  if ((*piVar2 == 0x22) && (uVar3 == 0xffffffffffffffff)) {
    nptr_local._4_4_ = 0xffffffff;
  }
  else {
    piVar2 = __errno_location();
    if ((*piVar2 == 0) && (0xffffffff < uVar3)) {
      piVar2 = __errno_location();
      *piVar2 = 0x22;
      nptr_local._4_4_ = 0xffffffff;
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0) {
        piVar2 = __errno_location();
        *piVar2 = iVar1;
      }
      nptr_local._4_4_ = (uint32)uVar3;
    }
  }
  return nptr_local._4_4_;
}

Assistant:

uint32 strtou32_adaptor(const char *nptr, char **endptr, int base) {
  const int saved_errno = errno;
  errno = 0;
  const unsigned long result = strtoul(nptr, endptr, base);
  if (errno == ERANGE && result == ULONG_MAX) {
    return kuint32max;
  } else if (errno == 0 && result > kuint32max) {
    errno = ERANGE;
    return kuint32max;
  }
  if (errno == 0)
    errno = saved_errno;
  return static_cast<uint32>(result);
}